

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqliteVmInstallCollection(unqlite_vm *pVm,unqlite_col *pCol)

{
  uint uVar1;
  unqlite_col *puVar2;
  sxu32 sVar3;
  unqlite_col **ppuVar4;
  unqlite_col **ppuVar5;
  uint uVar6;
  unqlite_col **ppuVar7;
  bool bVar8;
  
  sVar3 = SyBinHash((pCol->sName).zString,(pCol->sName).nByte);
  pCol->nHash = sVar3;
  uVar1 = pVm->iColSize;
  uVar6 = uVar1 - 1 & sVar3;
  ppuVar7 = pVm->apCol;
  pCol->pNextCol = ppuVar7[uVar6];
  if (ppuVar7[uVar6] != (unqlite_col *)0x0) {
    ppuVar7[uVar6]->pPrevCol = pCol;
  }
  ppuVar7[uVar6] = pCol;
  puVar2 = pVm->pCol;
  if (puVar2 != (unqlite_col *)0x0) {
    pCol->pNext = puVar2;
    puVar2->pPrev = pCol;
  }
  pVm->pCol = pCol;
  uVar6 = pVm->iCol + 1;
  pVm->iCol = uVar6;
  bVar8 = uVar6 < uVar1 * 4;
  ppuVar7 = (unqlite_col **)(ulong)CONCAT31((int3)(uVar6 >> 8),9999 < uVar6 || bVar8);
  if (9999 >= uVar6 && !bVar8) {
    ppuVar4 = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc,uVar1 << 4);
    ppuVar7 = ppuVar4;
    if (ppuVar4 != (unqlite_col **)0x0) {
      if ((uVar1 & 0xfffffff) != 0) {
        ppuVar5 = (unqlite_col **)((long)ppuVar4 + (ulong)(uVar1 << 4));
        do {
          *(undefined1 *)ppuVar7 = 0;
          if (ppuVar5 <= (unqlite_col **)((long)ppuVar7 + 1)) break;
          *(undefined1 *)((long)ppuVar7 + 1) = 0;
          if (ppuVar5 <= (unqlite_col **)((long)ppuVar7 + 2)) break;
          *(undefined1 *)((long)ppuVar7 + 2) = 0;
          if (ppuVar5 <= (unqlite_col **)((long)ppuVar7 + 3)) break;
          *(undefined1 *)((long)ppuVar7 + 3) = 0;
          ppuVar7 = (unqlite_col **)((long)ppuVar7 + 4);
        } while (ppuVar7 < ppuVar5);
      }
      sVar3 = pVm->iCol;
      if (sVar3 != 0) {
        ppuVar7 = &pVm->pCol;
        do {
          puVar2 = *ppuVar7;
          puVar2->pNextCol = (unqlite_col *)0x0;
          puVar2->pPrevCol = (unqlite_col *)0x0;
          uVar6 = puVar2->nHash & uVar1 * 2 - 1;
          puVar2->pNextCol = ppuVar4[uVar6];
          if (ppuVar4[uVar6] != (unqlite_col *)0x0) {
            ppuVar4[uVar6]->pPrevCol = puVar2;
          }
          ppuVar4[uVar6] = puVar2;
          ppuVar7 = &puVar2->pNext;
          sVar3 = sVar3 - 1;
        } while (sVar3 != 0);
      }
      uVar6 = SyMemBackendFree(&pVm->sAlloc,pVm->apCol);
      ppuVar7 = (unqlite_col **)(ulong)uVar6;
      pVm->apCol = ppuVar4;
      pVm->iColSize = uVar1 * 2;
    }
  }
  return (int)ppuVar7;
}

Assistant:

static int unqliteVmInstallCollection(
	unqlite_vm *pVm,  /* Target VM */
	unqlite_col *pCol /* Collection to install */
	)
{
	SyString *pName = &pCol->sName;
	sxu32 iBucket;
	/* Hash the collection name */
	pCol->nHash = SyBinHash((const void *)pName->zString,pName->nByte);
	/* Install it in the corresponding bucket */
	iBucket = pCol->nHash & (pVm->iColSize - 1);
	pCol->pNextCol = pVm->apCol[iBucket];
	if( pVm->apCol[iBucket] ){
		pVm->apCol[iBucket]->pPrevCol = pCol;
	}
	pVm->apCol[iBucket] = pCol;
	/* Link to the list of active collections */
	MACRO_LD_PUSH(pVm->pCol,pCol);
	pVm->iCol++;
	if( (pVm->iCol >= pVm->iColSize * 4) && pVm->iCol < 10000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = pVm->iColSize << 1;
		unqlite_col *pEntry;
		unqlite_col **apNew;
		sxu32 n;
		
		apNew = (unqlite_col **)SyMemBackendAlloc(&pVm->sAlloc, nNewSize * sizeof(unqlite_col *));
		if( apNew ){
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(unqlite_col *));
			/* Rehash all entries */
			n = 0;
			pEntry = pVm->pCol;
			for(;;){
				/* Loop one */
				if( n >= pVm->iCol ){
					break;
				}
				pEntry->pNextCol = pEntry->pPrevCol = 0;
				/* Install in the new bucket */
				iBucket = pEntry->nHash & (nNewSize - 1);
				pEntry->pNextCol = apNew[iBucket];
				if( apNew[iBucket]  ){
					apNew[iBucket]->pPrevCol = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(&pVm->sAlloc,(void *)pVm->apCol);
			pVm->apCol = apNew;
			pVm->iColSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}